

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O2

bool __thiscall
Assimp::AssbinImporter::CanRead
          (AssbinImporter *this,string *pFile,IOSystem *pIOHandler,bool param_3)

{
  int iVar1;
  undefined4 extraout_var;
  bool bVar3;
  allocator local_39;
  char s [32];
  long *plVar2;
  
  std::__cxx11::string::string((string *)s,"rb",&local_39);
  iVar1 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,s._0_8_);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  std::__cxx11::string::~string((string *)s);
  if (plVar2 == (long *)0x0) {
    bVar3 = false;
  }
  else {
    (**(code **)(*plVar2 + 0x10))(plVar2,s,1,0x20);
    (*pIOHandler->_vptr_IOSystem[5])(pIOHandler,plVar2);
    iVar1 = bcmp(s,"ASSIMP.binary-dump.",0x13);
    bVar3 = iVar1 == 0;
  }
  return bVar3;
}

Assistant:

bool AssbinImporter::CanRead( const std::string& pFile, IOSystem* pIOHandler, bool /*checkSig*/ ) const {
    IOStream * in = pIOHandler->Open(pFile);
    if (nullptr == in) {
        return false;
    }

    char s[32];
    in->Read( s, sizeof(char), 32 );

    pIOHandler->Close(in);

    return strncmp( s, "ASSIMP.binary-dump.", 19 ) == 0;
}